

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteRawMaybeAliased
          (EpsCopyOutputStream *this,void *data,int size,uint8_t *ptr)

{
  uint8_t *ptr_local;
  int size_local;
  void *data_local;
  EpsCopyOutputStream *this_local;
  
  if ((this->aliasing_enabled_ & 1U) == 0) {
    this_local = (EpsCopyOutputStream *)WriteRaw(this,data,size,ptr);
  }
  else {
    this_local = (EpsCopyOutputStream *)WriteAliasedRaw(this,data,size,ptr);
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* WriteRawMaybeAliased(const void* data, int size, uint8_t* ptr) {
    if (aliasing_enabled_) {
      return WriteAliasedRaw(data, size, ptr);
    } else {
      return WriteRaw(data, size, ptr);
    }
  }